

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

float dvx(qnode_ptr_t p,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  beaudet_t *pbVar5;
  int iVar6;
  long lVar7;
  float fVar8;
  
  iVar4 = Ix.m / 2;
  iVar6 = iVar4 * 3 + p->ofst;
  fVar8 = 0.0;
  if ((-2 < Ix.m && y < p->sizx - iVar6) && ((iVar6 <= y && iVar6 <= x) && x < p->sizy - iVar6)) {
    iVar2 = -iVar4;
    iVar6 = iVar4;
    if (iVar4 < 1) {
      iVar6 = iVar2;
    }
    iVar3 = (y + (x - iVar4) * p->res) - iVar4;
    iVar1 = iVar2;
    if (iVar4 != iVar2 && SBORROW4(iVar4,iVar2) == iVar4 * 2 < 0) {
      iVar1 = iVar4;
    }
    pbVar5 = &Ix;
    do {
      lVar7 = 0;
      do {
        fVar8 = fVar8 + (*p->flow_ptr)[iVar3 + (int)lVar7].y * pbVar5->g[0][lVar7];
        lVar7 = lVar7 + 1;
      } while (iVar4 + iVar1 + 1 != (int)lVar7);
      iVar2 = iVar2 + 1;
      pbVar5 = (beaudet_t *)(pbVar5->g + 1);
      iVar3 = iVar3 + p->res;
    } while (iVar6 + 1 != iVar2);
  }
  return fVar8 / Ix.f;
}

Assistant:

float dvx(p,x,y)
qnode_ptr_t p ;
int x, y ;

{ extern beaudet_t Ix ;
  float d ;
  int i, j, h ;

  h = Ix.m/2 ;
  d = 0.0 ;

  if (!overflow(x,y,p->sizy,p->sizx,p->ofst,h,3)) {
    for (i = -h ; i <= h ; i++) {
      for (j = -h ; j <= h ; j++) {
        d = d + (*p->flow_ptr)[p->res*(x+i) + y+j].y*Ix.g[i+h][j+h] ;
      }
    }
  }
  return(d/Ix.f) ;
}